

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  upb_Arena *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (n != 0) {
    uVar2 = (long)mem + 7U & 0xfffffffffffffff8;
    uVar3 = 0;
    if (uVar2 - (long)mem <= n) {
      uVar3 = n - (uVar2 - (long)mem);
    }
    if (0x37 < uVar3) {
      lVar4 = uVar2 + (uVar3 & 0xfffffffffffffff8);
      *(undefined8 *)(lVar4 + -0x20) = 3;
      *(undefined8 *)(lVar4 + -0x18) = 0;
      *(long *)(lVar4 + -0x10) = lVar4 + -0x28;
      *(undefined8 *)(lVar4 + -8) = 0;
      if (((ulong)alloc & 1) == 0) {
        lVar4 = (uVar3 & 0xfffffffffffffff8) + uVar2;
        *(ulong *)(lVar4 + -0x28) = (ulong)alloc | 1;
        *(ulong *)(lVar4 + -0x38) = uVar2;
        *(upb_Arena **)(lVar4 + -0x30) = (upb_Arena *)(lVar4 + -0x38);
        return (upb_Arena *)(lVar4 + -0x38);
      }
      __assert_fail("(alloc_uint & 1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/arena.c"
                    ,0x78,"uintptr_t _upb_Arena_MakeBlockAlloc(upb_alloc *, _Bool)");
    }
  }
  puVar1 = _upb_Arena_InitSlow(alloc);
  return puVar1;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (n) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_UP((uintptr_t)mem, UPB_MALLOC_ALIGN);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }

  /* Round block size down to alignof(*a) since we will allocate the arena
   * itself at the end. */
  n = UPB_ALIGN_DOWN(n, UPB_ALIGN_OF(upb_ArenaState));

  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState))) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena* ret = _upb_Arena_InitSlow(alloc);
    upb_Arena_LogInit(ret, n);
    return ret;
#else
    return _upb_Arena_InitSlow(alloc);
#endif
  }

  a = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), upb_ArenaState);

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.tail, &a->body);
  upb_Atomic_Init(&a->body.blocks, NULL);

  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = mem;
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), char);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}